

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

int __thiscall nite::UDPSocket::close(UDPSocket *this,int __fd)

{
  int in_EAX;
  int number;
  int number_00;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this->opened == true) {
    ::close(this->sock);
    this->opened = false;
    toStr_abi_cxx11_(&local_d8,(nite *)(ulong)this->port,number);
    std::operator+(&local_58,"UDP socket closed at ",&local_d8);
    std::operator+(&local_78,&local_58," (");
    toStr_abi_cxx11_(&local_38,(nite *)(ulong)(uint)this->sock,number_00);
    std::operator+(&local_98,&local_78,&local_38);
    std::operator+(&local_b8,&local_98,")");
    print(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    in_EAX = std::__cxx11::string::~string((string *)&local_d8);
  }
  return in_EAX;
}

Assistant:

void nite::UDPSocket::close(){
	if (opened){
		close_(sock);
		opened = false;
		nite::print("UDP socket closed at "+nite::toStr(port)+" ("+nite::toStr(sock)+")");

	}
}